

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

void parse_example_tweaks(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  bool *pbVar3;
  float *pfVar4;
  size_t *psVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  option_group_definition *poVar9;
  typed_option<unsigned_int> *op;
  typed_option<unsigned_long> *op_00;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *op_01;
  typed_option<float> *op_02;
  namedlabels *pnVar10;
  ostream *poVar11;
  loss_function *plVar12;
  options_i *poVar13;
  byte bVar14;
  float fVar15;
  float fVar16;
  bool test_only;
  float loss_parameter;
  string loss_function;
  string named_labels;
  option_group_definition example_options;
  size_t early_terminate_passes;
  bool local_1065;
  float local_1064;
  float *local_1060;
  options_i *local_1058;
  uint32_t *local_1050;
  bool *local_1048;
  float *local_1040;
  size_t *local_1038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1010;
  undefined1 *local_ff0 [2];
  undefined1 local_fe0 [16];
  string local_fd0;
  undefined1 *local_fb0 [2];
  undefined1 local_fa0 [16];
  string local_f90;
  undefined1 *local_f70 [2];
  undefined1 local_f60 [16];
  string local_f50;
  undefined1 *local_f30 [2];
  undefined1 local_f20 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  string local_ef0;
  undefined1 *local_ed0 [2];
  undefined1 local_ec0 [16];
  string local_eb0;
  undefined1 *local_e90 [2];
  undefined1 local_e80 [16];
  string local_e70;
  undefined1 *local_e50 [2];
  undefined1 local_e40 [16];
  string local_e30;
  undefined1 *local_e10 [2];
  undefined1 local_e00 [16];
  string local_df0;
  undefined1 *local_dd0 [2];
  undefined1 local_dc0 [16];
  string local_db0;
  undefined1 *local_d90 [2];
  undefined1 local_d80 [16];
  string local_d70;
  undefined1 *local_d50 [2];
  undefined1 local_d40 [16];
  string local_d30;
  undefined1 *local_d10 [2];
  undefined1 local_d00 [16];
  string local_cf0;
  undefined1 *local_cd0 [2];
  undefined1 local_cc0 [16];
  string local_cb0;
  undefined1 *local_c90 [2];
  undefined1 local_c80 [16];
  string local_c70;
  undefined1 *local_c50 [2];
  undefined1 local_c40 [16];
  undefined1 *local_c30 [2];
  undefined1 local_c20 [16];
  string local_c10;
  undefined1 *local_bf0;
  long local_be8;
  undefined1 local_be0 [16];
  option_group_definition local_bd0;
  string local_b98;
  string local_b78;
  undefined1 *local_b58 [2];
  undefined1 local_b48 [16];
  string local_b38;
  undefined1 *local_b18 [2];
  undefined1 local_b08 [16];
  string local_af8;
  undefined1 local_ad8 [80];
  string local_a88 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a40;
  unsigned_long local_a38;
  undefined1 local_a30 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_998;
  undefined1 local_990 [112];
  bool local_920;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  undefined1 local_8f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_858;
  undefined1 local_850 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b8;
  undefined1 local_7b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_718;
  undefined1 local_710 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_678;
  undefined1 local_670 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d8;
  undefined1 local_5d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  undefined1 local_530 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<float> local_2b0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  typed_option<unsigned_long> local_170;
  typed_option<unsigned_int> local_d0;
  
  local_1010._M_dataplus._M_p = (pointer)&local_1010.field_2;
  local_1010._M_string_length = 0;
  local_1010.field_2._M_local_buf[0] = '\0';
  local_1030._M_dataplus._M_p = (pointer)&local_1030.field_2;
  local_1030._M_string_length = 0;
  local_1030.field_2._M_local_buf[0] = '\0';
  local_1064 = 0.0;
  local_1065 = false;
  local_bf0 = local_be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf0,"Example options","");
  local_bd0.m_name._M_dataplus._M_p = (pointer)&local_bd0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_bd0,local_bf0,local_bf0 + local_be8);
  local_bd0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_bd0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bd0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_bf0 != local_be0) {
    operator_delete(local_bf0);
  }
  local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"testonly","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_ad8,&local_c10,&local_1065);
  local_c30[0] = local_c20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c30,"t","");
  std::__cxx11::string::_M_assign(local_a88);
  local_c50[0] = local_c40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c50,"Ignore label information and just test","");
  std::__cxx11::string::_M_assign((string *)(local_ad8 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_bd0,(typed_option<bool> *)local_ad8);
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c70,"holdout_off","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_a30,&local_c70,&all->holdout_set_off);
  local_c90[0] = local_c80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c90,"no holdout data in multiple passes","");
  std::__cxx11::string::_M_assign((string *)(local_a30 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar9,(typed_option<bool> *)local_a30);
  local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb0,"holdout_period","");
  VW::config::typed_option<unsigned_int>::typed_option(&local_d0,&local_cb0,&all->holdout_period);
  op = VW::config::typed_option<unsigned_int>::default_value(&local_d0,10);
  local_cd0[0] = local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cd0,"holdout period for test only","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar9,op);
  local_cf0._M_dataplus._M_p = (pointer)&local_cf0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf0,"holdout_after","");
  local_1050 = &all->holdout_after;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_350,&local_cf0,local_1050);
  local_d10[0] = local_d00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d10,
             "holdout after n training examples, default off (disables holdout_period)","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar9,(typed_option<unsigned_int> *)local_350);
  local_d30._M_dataplus._M_p = (pointer)&local_d30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d30,"early_terminate","");
  VW::config::typed_option<unsigned_long>::typed_option(&local_170,&local_d30,&local_a38);
  op_00 = VW::config::typed_option<unsigned_long>::default_value(&local_170,3);
  local_d50[0] = local_d40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d50,
             "Specify the number of passes tolerated when holdout loss doesn\'t decrease before early termination"
             ,"");
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar9,op_00);
  local_d70._M_dataplus._M_p = (pointer)&local_d70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d70,"passes","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_3f0,&local_d70,&all->numpasses);
  local_d90[0] = local_d80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d90,"Number of Training Passes","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar9,(typed_option<unsigned_long> *)local_3f0);
  local_db0._M_dataplus._M_p = (pointer)&local_db0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_db0,"initial_pass_length","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_490,&local_db0,&all->pass_length);
  local_dd0[0] = local_dc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dd0,"initial number of examples per pass","");
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar9,(typed_option<unsigned_long> *)local_490);
  local_df0._M_dataplus._M_p = (pointer)&local_df0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_df0,"examples","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_530,&local_df0,&all->max_examples);
  local_e10[0] = local_e00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e10,"number of examples to parse","");
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar9,(typed_option<unsigned_long> *)local_530);
  local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e30,"min_prediction","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_5d0,&local_e30,&all->sd->min_label);
  local_e50[0] = local_e40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e50,"Smallest prediction to output","");
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar9,(typed_option<float> *)local_5d0);
  local_e70._M_dataplus._M_p = (pointer)&local_e70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e70,"max_prediction","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_670,&local_e70,&all->sd->max_label);
  local_e90[0] = local_e80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e90,"Largest prediction to output","");
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar9,(typed_option<float> *)local_670);
  local_eb0._M_dataplus._M_p = (pointer)&local_eb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_eb0,"sort_features","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_710,&local_eb0,&all->p->sort_features);
  local_ed0[0] = local_ec0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ed0,
             "turn this on to disregard order in which features have been defined. This will lead to smaller cache sizes"
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar9,(typed_option<bool> *)local_710);
  local_ef0._M_dataplus._M_p = (pointer)&local_ef0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ef0,"loss_function","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_210,&local_ef0,&local_1030);
  local_f10._M_dataplus._M_p = (pointer)&local_f10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f10,"squared","");
  op_01 = VW::config::
          typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::default_value(&local_210,&local_f10);
  local_f30[0] = local_f20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f30,
             "Specify the loss function to be used, uses squared by default. Currently available ones are squared, classic, hinge, logistic, quantile and poisson."
             ,"");
  std::__cxx11::string::_M_assign((string *)&(op_01->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar9,op_01);
  local_f50._M_dataplus._M_p = (pointer)&local_f50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f50,"quantile_tau","");
  VW::config::typed_option<float>::typed_option(&local_2b0,&local_f50,&local_1064);
  op_02 = VW::config::typed_option<float>::default_value(&local_2b0,0.5);
  local_f70[0] = local_f60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f70,"Parameter \\tau associated with Quantile loss. Defaults to 0.5",""
            );
  std::__cxx11::string::_M_assign((string *)&(op_02->super_base_option).m_help);
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar9,op_02);
  local_f90._M_dataplus._M_p = (pointer)&local_f90.field_2;
  local_1038 = &all->numpasses;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f90,"l1","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_7b0,&local_f90,&all->l1_lambda);
  local_fb0[0] = local_fa0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fb0,"l_1 lambda","");
  std::__cxx11::string::_M_assign((string *)(local_7b0 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar9,(typed_option<float> *)local_7b0);
  local_fd0._M_dataplus._M_p = (pointer)&local_fd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fd0,"l2","");
  local_1060 = &all->l2_lambda;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_850,&local_fd0,local_1060);
  local_ff0[0] = local_fe0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ff0,"l_2 lambda","");
  local_1040 = &all->l1_lambda;
  std::__cxx11::string::_M_assign((string *)(local_850 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar9,(typed_option<float> *)local_850);
  local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_af8,"no_bias_regularization","");
  local_1048 = &all->holdout_set_off;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_8f0,&local_af8,&all->no_bias);
  local_b18[0] = local_b08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b18,"no bias in regularization","");
  std::__cxx11::string::_M_assign((string *)(local_8f0 + 0x30));
  poVar9 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar9,(typed_option<bool> *)local_8f0);
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b38,"named_labels","");
  local_1058 = options;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990,&local_b38,&local_1010);
  local_920 = true;
  local_b58[0] = local_b48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b58,
             "use names for labels (multiclass, etc.) rather than integers, argument specified all possible labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar9,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_990);
  if (local_b58[0] != local_b48) {
    operator_delete(local_b58[0]);
  }
  local_990._0_8_ = &PTR__typed_option_002da680;
  if (local_8f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8f8._M_pi);
  }
  if (local_908._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_908._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p);
  }
  if (local_b18[0] != local_b08) {
    operator_delete(local_b18[0]);
  }
  local_8f0._0_8_ = &PTR__typed_option_002da618;
  if (local_858._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_858._M_pi);
  }
  if (local_868._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_868._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    operator_delete(local_af8._M_dataplus._M_p);
  }
  if (local_ff0[0] != local_fe0) {
    operator_delete(local_ff0[0]);
  }
  local_850._0_8_ = &PTR__typed_option_002da728;
  if (local_7b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b8._M_pi);
  }
  if (local_7c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_850);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd0._M_dataplus._M_p != &local_fd0.field_2) {
    operator_delete(local_fd0._M_dataplus._M_p);
  }
  if (local_fb0[0] != local_fa0) {
    operator_delete(local_fb0[0]);
  }
  local_7b0._0_8_ = &PTR__typed_option_002da728;
  if (local_718._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_718._M_pi);
  }
  if (local_728._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_728._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_7b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f90._M_dataplus._M_p != &local_f90.field_2) {
    operator_delete(local_f90._M_dataplus._M_p);
  }
  if (local_f70[0] != local_f60) {
    operator_delete(local_f70[0]);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da728;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p);
  }
  if (local_f30[0] != local_f20) {
    operator_delete(local_f30[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f10._M_dataplus._M_p != &local_f10.field_2) {
    operator_delete(local_f10._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da680;
  if (local_210.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef0._M_dataplus._M_p != &local_ef0.field_2) {
    operator_delete(local_ef0._M_dataplus._M_p);
  }
  if (local_ed0[0] != local_ec0) {
    operator_delete(local_ed0[0]);
  }
  local_710._0_8_ = &PTR__typed_option_002da618;
  if (local_678._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_678._M_pi);
  }
  if (local_688._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_688._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_eb0._M_dataplus._M_p != &local_eb0.field_2) {
    operator_delete(local_eb0._M_dataplus._M_p);
  }
  if (local_e90[0] != local_e80) {
    operator_delete(local_e90[0]);
  }
  local_670._0_8_ = &PTR__typed_option_002da728;
  if (local_5d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8._M_pi);
  }
  if (local_5e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e70._M_dataplus._M_p != &local_e70.field_2) {
    operator_delete(local_e70._M_dataplus._M_p);
  }
  if (local_e50[0] != local_e40) {
    operator_delete(local_e50[0]);
  }
  local_5d0._0_8_ = &PTR__typed_option_002da728;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
    operator_delete(local_e30._M_dataplus._M_p);
  }
  if (local_e10[0] != local_e00) {
    operator_delete(local_e10[0]);
  }
  local_530._0_8_ = &PTR__typed_option_002da6f0;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df0._M_dataplus._M_p != &local_df0.field_2) {
    operator_delete(local_df0._M_dataplus._M_p);
  }
  if (local_dd0[0] != local_dc0) {
    operator_delete(local_dd0[0]);
  }
  local_490._0_8_ = &PTR__typed_option_002da6f0;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db0._M_dataplus._M_p != &local_db0.field_2) {
    operator_delete(local_db0._M_dataplus._M_p);
  }
  if (local_d90[0] != local_d80) {
    operator_delete(local_d90[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002da6f0;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
    operator_delete(local_d70._M_dataplus._M_p);
  }
  psVar5 = local_1038;
  if (local_d50[0] != local_d40) {
    operator_delete(local_d50[0]);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da6f0;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
    operator_delete(local_d30._M_dataplus._M_p);
  }
  if (local_d10[0] != local_d00) {
    operator_delete(local_d10[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002da760;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf0._M_dataplus._M_p != &local_cf0.field_2) {
    operator_delete(local_cf0._M_dataplus._M_p);
  }
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0]);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002da760;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pbVar3 = local_1048;
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
    operator_delete(local_cb0._M_dataplus._M_p);
  }
  if (local_c90[0] != local_c80) {
    operator_delete(local_c90[0]);
  }
  local_a30._0_8_ = &PTR__typed_option_002da618;
  if (local_998._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_998._M_pi);
  }
  if (local_9a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_a30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p);
  }
  if (local_c50[0] != local_c40) {
    operator_delete(local_c50[0]);
  }
  if (local_c30[0] != local_c20) {
    operator_delete(local_c30[0]);
  }
  poVar13 = local_1058;
  local_ad8._0_8_ = &PTR__typed_option_002da618;
  if (local_a40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a40._M_pi);
  }
  if (local_a50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a50._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_ad8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
    operator_delete(local_c10._M_dataplus._M_p);
  }
  (**poVar13->_vptr_options_i)(poVar13,&local_bd0);
  pfVar4 = local_1040;
  if ((local_1065 == false) && ((all->eta != 0.0 || (NAN(all->eta))))) {
    all->training = true;
  }
  else {
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,"only testing",0xc);
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
    all->training = false;
    if (all->lda != 0) {
      all->eta = 0.0;
    }
  }
  if (((*psVar5 < 2) && (*local_1050 == 0)) || (*pbVar3 == true)) {
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
  *pbVar3 = bVar6;
  pp_Var2 = (_func_int **)(local_ad8 + 0x10);
  local_ad8._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ad8,"min_prediction","");
  iVar7 = (*poVar13->_vptr_options_i[1])(poVar13,local_ad8);
  bVar14 = 1;
  if ((char)iVar7 == '\0') {
    local_a30._0_8_ = local_a30 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"max_prediction","");
    iVar7 = (*poVar13->_vptr_options_i[1])(poVar13,local_a30);
    bVar6 = local_1065;
    if ((undefined1 *)local_a30._0_8_ != local_a30 + 0x10) {
      operator_delete((void *)local_a30._0_8_);
    }
    bVar14 = (byte)iVar7 | bVar6;
    poVar13 = local_1058;
  }
  if ((_func_int **)local_ad8._0_8_ != pp_Var2) {
    operator_delete((void *)local_ad8._0_8_);
  }
  if ((bVar14 & 1) != 0) {
    all->set_minmax = noop_mm;
  }
  local_ad8._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ad8,"named_labels","");
  iVar7 = (*poVar13->_vptr_options_i[1])(poVar13,local_ad8);
  if ((_func_int **)local_ad8._0_8_ != pp_Var2) {
    operator_delete((void *)local_ad8._0_8_);
  }
  if ((char)iVar7 != '\0') {
    pnVar10 = calloc_or_throw<namedlabels>(1);
    all->sd->ldict = pnVar10;
    pnVar10 = all->sd->ldict;
    local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b78,local_1010._M_dataplus._M_p,
               local_1010._M_dataplus._M_p + local_1010._M_string_length);
    namedlabels::namedlabels(pnVar10,&local_b78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
      operator_delete(local_b78._M_dataplus._M_p);
    }
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"parsed ",7);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&all->trace_message);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," named labels",0xd);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
    }
  }
  local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b98,local_1030._M_dataplus._M_p,
             local_1030._M_dataplus._M_p + local_1030._M_string_length);
  plVar12 = getLossFunction(all,&local_b98,local_1064);
  all->loss = plVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
    operator_delete(local_b98._M_dataplus._M_p);
  }
  fVar15 = *pfVar4;
  if (fVar15 < 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "l1_lambda should be nonnegative: resetting from ",0x30);
    poVar11 = std::ostream::_M_insert<double>((double)*pfVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," to 0",5);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    *pfVar4 = 0.0;
    fVar15 = 0.0;
  }
  fVar16 = *local_1060;
  if (fVar16 < 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,
               "l2_lambda should be nonnegative: resetting from ",0x30);
    poVar11 = std::ostream::_M_insert<double>((double)*local_1060);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," to 0",5);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    *local_1060 = 0.0;
    fVar15 = *pfVar4;
    fVar16 = 0.0;
  }
  uVar8 = (uint)(0.0 < fVar15) + all->reg_mode;
  all->reg_mode = uVar8 + (uint)(0.0 < fVar16) * 2;
  if (all->quiet == false) {
    if ((uVar8 & 1) != 0) {
      local_ad8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_ad8,"bfgs","");
      iVar7 = (*poVar13->_vptr_options_i[1])(poVar13,local_ad8);
      if ((_func_int **)local_ad8._0_8_ != pp_Var2) {
        operator_delete((void *)local_ad8._0_8_);
      }
      if ((char)iVar7 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(all->trace_message).super_ostream,"using l1 regularization = ",0x1a);
        poVar11 = std::ostream::_M_insert<double>((double)*pfVar4);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
    }
    if (1 < all->reg_mode) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"using l2 regularization = ",0x1a);
      poVar11 = std::ostream::_M_insert<double>((double)*local_1060);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_bd0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd0.m_name._M_dataplus._M_p != &local_bd0.m_name.field_2) {
    operator_delete(local_bd0.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1030._M_dataplus._M_p != &local_1030.field_2) {
    operator_delete(local_1030._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1010._M_dataplus._M_p != &local_1010.field_2) {
    operator_delete(local_1010._M_dataplus._M_p);
  }
  return;
}

Assistant:

void parse_example_tweaks(options_i& options, vw& all)
{
  string named_labels;
  string loss_function;
  float loss_parameter = 0.0;
  size_t early_terminate_passes;
  bool test_only = false;

  option_group_definition example_options("Example options");
  example_options.add(make_option("testonly", test_only).short_name("t").help("Ignore label information and just test"))
      .add(make_option("holdout_off", all.holdout_set_off).help("no holdout data in multiple passes"))
      .add(make_option("holdout_period", all.holdout_period).default_value(10).help("holdout period for test only"))
      .add(make_option("holdout_after", all.holdout_after)
               .help("holdout after n training examples, default off (disables holdout_period)"))
      .add(
          make_option("early_terminate", early_terminate_passes)
              .default_value(3)
              .help(
                  "Specify the number of passes tolerated when holdout loss doesn't decrease before early termination"))
      .add(make_option("passes", all.numpasses).help("Number of Training Passes"))
      .add(make_option("initial_pass_length", all.pass_length).help("initial number of examples per pass"))
      .add(make_option("examples", all.max_examples).help("number of examples to parse"))
      .add(make_option("min_prediction", all.sd->min_label).help("Smallest prediction to output"))
      .add(make_option("max_prediction", all.sd->max_label).help("Largest prediction to output"))
      .add(make_option("sort_features", all.p->sort_features)
               .help("turn this on to disregard order in which features have been defined. This will lead to smaller "
                     "cache sizes"))
      .add(make_option("loss_function", loss_function)
               .default_value("squared")
               .help("Specify the loss function to be used, uses squared by default. Currently available ones are "
                     "squared, classic, hinge, logistic, quantile and poisson."))
      .add(make_option("quantile_tau", loss_parameter)
               .default_value(0.5f)
               .help("Parameter \\tau associated with Quantile loss. Defaults to 0.5"))
      .add(make_option("l1", all.l1_lambda).help("l_1 lambda"))
      .add(make_option("l2", all.l2_lambda).help("l_2 lambda"))
      .add(make_option("no_bias_regularization", all.no_bias).help("no bias in regularization"))
      .add(make_option("named_labels", named_labels)
               .keep()
               .help("use names for labels (multiclass, etc.) rather than integers, argument specified all possible "
                     "labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""));
  options.add_and_parse(example_options);

  if (test_only || all.eta == 0.)
  {
    if (!all.quiet)
      all.trace_message << "only testing" << endl;
    all.training = false;
    if (all.lda > 0)
      all.eta = 0;
  }
  else
    all.training = true;

  if ((all.numpasses > 1 || all.holdout_after > 0) && !all.holdout_set_off)
    all.holdout_set_off = false;  // holdout is on unless explicitly off
  else
    all.holdout_set_off = true;

  if (options.was_supplied("min_prediction") || options.was_supplied("max_prediction") || test_only)
    all.set_minmax = noop_mm;

  if (options.was_supplied("named_labels"))
  {
    all.sd->ldict = &calloc_or_throw<namedlabels>();
    new (all.sd->ldict) namedlabels(named_labels);
    if (!all.quiet)
      all.trace_message << "parsed " << all.sd->ldict->getK() << " named labels" << endl;
  }

  all.loss = getLossFunction(all, loss_function, loss_parameter);

  if (all.l1_lambda < 0.)
  {
    all.trace_message << "l1_lambda should be nonnegative: resetting from " << all.l1_lambda << " to 0" << endl;
    all.l1_lambda = 0.;
  }
  if (all.l2_lambda < 0.)
  {
    all.trace_message << "l2_lambda should be nonnegative: resetting from " << all.l2_lambda << " to 0" << endl;
    all.l2_lambda = 0.;
  }
  all.reg_mode += (all.l1_lambda > 0.) ? 1 : 0;
  all.reg_mode += (all.l2_lambda > 0.) ? 2 : 0;
  if (!all.quiet)
  {
    if (all.reg_mode % 2 && !options.was_supplied("bfgs"))
      all.trace_message << "using l1 regularization = " << all.l1_lambda << endl;
    if (all.reg_mode > 1)
      all.trace_message << "using l2 regularization = " << all.l2_lambda << endl;
  }
}